

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

void __thiscall
asio::detail::
io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
::io_object_impl(io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                 *this,int param_2,executor_type *ex)

{
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pdVar1;
  undefined8 *in_RDI;
  implementation_type *in_stack_ffffffffffffffb8;
  any_io_executor *in_stack_ffffffffffffffc0;
  
  get_context<asio::any_io_executor>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pdVar1 = use_service<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>
                     ((execution_context *)0x1d6fa2);
  *in_RDI = pdVar1;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::implementation_type::implementation_type((implementation_type *)(in_RDI + 1));
  pdVar1 = (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *)(in_RDI + 8);
  any_io_executor::any_io_executor
            ((any_io_executor *)pdVar1,(any_io_executor *)in_stack_ffffffffffffffb8);
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::construct(pdVar1,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

explicit io_object_impl(int, const executor_type& ex)
    : service_(&asio::use_service<IoObjectService>(
          io_object_impl::get_context(ex))),
      executor_(ex)
  {
    service_->construct(implementation_);
  }